

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall crnlib::dxt_hc::determine_alpha_endpoints(dxt_hc *this)

{
  vector<crnlib::dxt_hc::alpha_cluster> *this_00;
  long lVar1;
  int *piVar2;
  float fVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  tile_details *ptVar8;
  undefined8 uVar9;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar10;
  task_pool *ptVar11;
  alpha_cluster *paVar12;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar13;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar14;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar15;
  bool bVar16;
  pointer __first;
  pointer pNVar17;
  bool bVar18;
  uint uVar19;
  int iVar20;
  executable_task *peVar21;
  int iVar22;
  uint uVar23;
  Node *__y;
  Node *extraout_RDX;
  void *pvVar24;
  code *in_R8;
  _Iter_comp_val<std::less<Node>_> *in_R9;
  long lVar25;
  void *pvVar26;
  long lVar27;
  elemental_vector *peVar28;
  long lVar29;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar30;
  ulong uVar31;
  ulong uVar32;
  uint64 uVar33;
  Node __value;
  vector<Node>_conflict1 nodes;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> endpoints;
  vector<unsigned_int> weights;
  vector<crnlib::vec<2U,_float>_> vectors;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> queue;
  tree_clusterizer<crnlib::vec<2U,_float>_> vq;
  ulong local_178;
  elemental_vector local_168;
  elemental_vector local_158;
  vector<unsigned_int> local_148;
  vector<crnlib::vec<2U,_float>_> local_138;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_120;
  dxt_hc *local_118;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *local_110;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> local_108;
  Node *local_e8;
  ulong local_e0;
  tree_clusterizer<crnlib::vec<2U,_float>_> local_d8;
  
  uVar6 = this->m_pTask_pool->m_num_threads;
  local_158.m_p = (void *)0x0;
  local_158.m_size = 0;
  local_158.m_capacity = 0;
  if (this->m_num_alpha_blocks != 0) {
    lVar29 = 0x2c;
    uVar32 = 0;
    do {
      local_118 = (dxt_hc *)uVar32;
      if ((this->m_tiles).m_size != 0) {
        lVar25 = 0;
        uVar32 = 0;
        do {
          ptVar8 = (this->m_tiles).m_p;
          iVar22 = *(int *)((long)(ptVar8->color_endpoint).m_s + lVar25 + -0xc);
          if (iVar22 != 0) {
            uVar9 = *(undefined8 *)((long)(ptVar8->color_endpoint).m_s + lVar25 + lVar29 + -0x14);
            if (local_158.m_capacity <= local_158.m_size) {
              in_R8 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::object_mover;
              in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
              elemental_vector::increase_capacity
                        (&local_158,local_158.m_size + 1,true,0xc,
                         vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::object_mover,
                         false);
            }
            *(undefined8 *)((long)local_158.m_p + (local_158._8_8_ & 0xffffffff) * 0xc) = uVar9;
            *(int *)((long)local_158.m_p + (local_158._8_8_ & 0xffffffff) * 0xc + 8) = iVar22;
            local_158.m_size = local_158.m_size + 1;
          }
          uVar32 = uVar32 + 1;
          lVar25 = lVar25 + 0x48;
        } while (uVar32 < (this->m_tiles).m_size);
      }
      uVar32 = (long)local_118 + 1;
      lVar29 = lVar29 + 8;
    } while (uVar32 < this->m_num_alpha_blocks);
  }
  local_168.m_p = (void *)0x0;
  local_168.m_size = 0;
  local_168.m_capacity = 0;
  uVar19 = uVar6 + 1;
  if (uVar19 != 0) {
    iVar22 = 1;
    pvVar24 = local_158.m_p;
    do {
      pvVar26 = (void *)(((ulong)(local_158.m_size * iVar22) / (ulong)uVar19) * 0xc +
                        (long)local_158.m_p);
      if (pvVar24 != pvVar26) {
        if (local_168.m_capacity <= local_168.m_size) {
          in_R8 = vector<Node>::object_mover;
          in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          elemental_vector::increase_capacity
                    (&local_168,local_168.m_size + 1,true,0x10,vector<Node>::object_mover,false);
        }
        lVar29 = (local_168._8_8_ & 0xffffffff) * 0x10;
        *(void **)((long)local_168.m_p + lVar29) = pvVar24;
        *(void **)((long)local_168.m_p + lVar29 + 8) = pvVar26;
        local_168.m_size = local_168.m_size + 1;
      }
      iVar20 = iVar22 - uVar6;
      iVar22 = iVar22 + 1;
      pvVar24 = pvVar26;
    } while (iVar20 != 1);
  }
  if (local_168.m_size != 0) {
    lVar29 = 0;
    uVar33 = 0;
    do {
      task_pool::queue_task
                (this->m_pTask_pool,determine_alpha_endpoints::Node::sort_task,uVar33,
                 (void *)((long)local_168.m_p + lVar29));
      uVar33 = uVar33 + 1;
      lVar29 = lVar29 + 0x10;
    } while (uVar33 < (local_168._8_8_ & 0xffffffff));
  }
  task_pool::join(this->m_pTask_pool);
  local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_168.m_size != 0) {
    lVar29 = 0;
    uVar32 = 0;
    do {
      std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                (&local_108,(value_type_conflict *)((long)local_168.m_p + lVar29));
      uVar32 = uVar32 + 1;
      lVar29 = lVar29 + 0x10;
    } while (uVar32 < (local_168._8_8_ & 0xffffffff));
  }
  local_138.m_p = (vec<2U,_float> *)0x0;
  local_138.m_size = 0;
  local_138.m_capacity = 0;
  local_148.m_p = (uint *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  vector<crnlib::vec<2U,_float>_>::reserve(&local_138,local_158.m_size);
  vector<unsigned_int>::reserve(&local_148,local_158.m_size);
  local_118 = this;
  if (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    do {
      pNVar17 = local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_finish;
      __first = local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVar13 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)
                (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start)->p;
      local_d8.m_weightedVectors.m_p =
           (vec<2U,_float> *)
           (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start)->pEnd;
      ppVar30 = ppVar13 + 1;
      local_d8.m_vectors = &ppVar30->first;
      if (0x10 < (long)local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_start) {
        local_110 = local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].p;
        ppVar10 = local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].pEnd;
        ppVar14 = (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start)->pEnd;
        local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].p =
             (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start)->p;
        local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].pEnd = ppVar14;
        local_e0 = (long)local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                   (-0x10 - (long)local_108.c.super__Vector_base<Node,_std::allocator<Node>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        __y = (Node *)((long)local_e0 >> 4);
        local_120 = ppVar30;
        local_e8 = __y;
        if ((long)__y < 3) {
          lVar29 = 0;
        }
        else {
          lVar27 = (long)__y + (-1 - ((long)((long)&__y[-1].pEnd + 7) >> 0x3f));
          lVar25 = 0;
          do {
            lVar1 = lVar25 * 2 + 2;
            lVar29 = lVar25 * 2 + 1;
            bVar18 = std::less<Node>::operator()
                               ((less<Node> *)(__first + lVar1),(Node *)(__first + lVar29),__y);
            if (!bVar18) {
              lVar29 = lVar1;
            }
            ppVar30 = ((Node *)(__first + lVar29))->pEnd;
            ((Node *)(__first + lVar25))->p = ((Node *)(__first + lVar29))->p;
            ((Node *)(__first + lVar25))->pEnd = ppVar30;
            __y = extraout_RDX;
            lVar25 = lVar29;
          } while (lVar29 < lVar27 >> 1);
        }
        this = local_118;
        ppVar30 = local_120;
        if (((local_e0 & 0x10) == 0) && (lVar29 == (long)((long)&local_e8[-1].pEnd + 6) >> 1)) {
          lVar25 = lVar29 * 2 + 1;
          ppVar15 = ((Node *)(__first + lVar25))->pEnd;
          ((Node *)(__first + lVar29))->p = ((Node *)(__first + lVar25))->p;
          ((Node *)(__first + lVar29))->pEnd = ppVar15;
          lVar29 = lVar25;
        }
        __value.pEnd = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)in_R8;
        __value.p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)ppVar10;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<crnlib::dxt_hc::determine_alpha_endpoints()::Node*,std::vector<crnlib::dxt_hc::determine_alpha_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_alpha_endpoints()::Node>>>,long,crnlib::dxt_hc::determine_alpha_endpoints()::Node,__gnu_cxx::__ops::_Iter_comp_val<std::less<crnlib::dxt_hc::determine_alpha_endpoints()::Node>>>
                  ((__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>)__first,
                   lVar29,(long)local_110,__value,in_R9);
      }
      local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish = pNVar17 + -1;
      if (ppVar30 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_d8.m_weightedVectors.m_p) {
        std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                  (&local_108,(value_type_conflict *)&local_d8);
      }
      if (local_138.m_size == 0) {
LAB_0018480a:
        if (local_138.m_capacity <= local_138.m_size) {
          in_R8 = (code *)0x0;
          in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_138,local_138.m_size + 1,true,8,(object_mover)0x0,
                     false);
        }
        *(undefined8 *)local_138.m_p[local_138._8_8_ & 0xffffffff].m_s =
             *(undefined8 *)(ppVar13->first).m_s;
        local_138.m_size = local_138.m_size + 1;
        if (local_148.m_capacity <= local_148.m_size) {
          in_R8 = (code *)0x0;
          in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_148,local_148.m_size + 1,true,4,(object_mover)0x0,
                     false);
        }
        local_148.m_p[local_148._8_8_ & 0xffffffff] = ppVar13->second;
        local_148.m_size = local_148.m_size + 1;
      }
      else {
        fVar3 = (ppVar13->first).m_s[0];
        if ((fVar3 != local_138.m_p[local_138.m_size - 1].m_s[0]) ||
           (NAN(fVar3) || NAN(local_138.m_p[local_138.m_size - 1].m_s[0]))) goto LAB_0018480a;
        bVar18 = false;
        do {
          bVar16 = bVar18;
          if (bVar16) goto LAB_001847e8;
          fVar3 = (ppVar13->first).m_s[1];
        } while ((fVar3 == local_138.m_p[local_138.m_size - 1].m_s[1]) &&
                (bVar18 = true, !NAN(fVar3) && !NAN(local_138.m_p[local_138.m_size - 1].m_s[1])));
        if (!bVar16) goto LAB_0018480a;
LAB_001847e8:
        uVar23 = local_148.m_size - 1;
        if (CARRY4(local_148.m_p[uVar23],ppVar13->second)) {
          local_148.m_p[uVar23] = 0xffffffff;
        }
        else {
          local_148.m_p[uVar23] = local_148.m_p[uVar23] + ppVar13->second;
        }
      }
    } while (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  local_110 = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)
              local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_d8.m_node_index_map.m_values.m_p = (raw_node *)0x0;
  local_d8.m_node_index_map.m_values.m_size = 0;
  local_d8.m_node_index_map.m_values.m_capacity = 0;
  local_d8.m_vectorComparison.m_p = (bool *)0x0;
  local_d8.m_vectorComparison.m_size = 0;
  local_d8.m_vectorComparison.m_capacity = 0;
  local_d8.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfoRight.m_size = 0;
  local_d8.m_vectorsInfoRight.m_capacity = 0;
  local_d8.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfoLeft.m_size = 0;
  local_d8.m_vectorsInfoLeft.m_capacity = 0;
  local_d8.m_vectorsInfo.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfo.m_size = 0;
  local_d8.m_vectorsInfo.m_capacity = 0;
  local_d8.m_weightedDotProducts.m_p = (double *)0x0;
  local_d8.m_weightedDotProducts.m_size = 0;
  local_d8.m_weightedDotProducts.m_capacity = 0;
  local_d8.m_weightedVectors.m_p = (vec<2U,_float> *)0x0;
  local_d8.m_weightedVectors.m_size = 0;
  local_d8.m_weightedVectors.m_capacity = 0;
  local_d8.m_node_index_map.m_hash_shift = 0x20;
  local_d8.m_node_index_map.m_num_valid = 0;
  local_d8.m_node_index_map.m_grow_threshold = 0;
  local_d8.m_nodes.m_p = (vq_node *)0x0;
  local_d8.m_nodes.m_size = 0;
  local_d8.m_nodes.m_capacity = 0;
  local_d8.m_codebook.m_p = (vec<2U,_float> *)0x0;
  local_d8.m_codebook.m_size = 0;
  local_d8.m_codebook.m_capacity = 0;
  uVar23 = (this->m_params).m_alpha_endpoint_codebook_size;
  if (this->m_num_tiles < uVar23) {
    uVar23 = this->m_num_tiles;
  }
  tree_clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
            (&local_d8,local_138.m_p,local_148.m_p,local_138.m_size,uVar23,false,this->m_pTask_pool)
  ;
  this_00 = &this->m_alpha_clusters;
  vector<crnlib::dxt_hc::alpha_cluster>::resize(this_00,local_d8.m_codebook.m_size,false);
  local_120 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)(ulong)uVar19;
  if (uVar19 != 0) {
    uVar33 = 0;
    do {
      ptVar11 = this->m_pTask_pool;
      peVar21 = (executable_task *)crnlib_malloc(0x28);
      peVar21->_vptr_executable_task = (_func_int **)&PTR_execute_task_001de950;
      peVar21[1]._vptr_executable_task = (_func_int **)this;
      peVar21[2]._vptr_executable_task = (_func_int **)determine_alpha_endpoint_clusters_task;
      peVar21[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&peVar21[4]._vptr_executable_task = 1;
      task_pool::queue_task(ptVar11,peVar21,uVar33,&local_d8);
      uVar33 = uVar33 + 1;
    } while (local_120 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)uVar33);
  }
  task_pool::join(this->m_pTask_pool);
  if (this->m_num_alpha_blocks != 0) {
    local_178 = 0;
    do {
      if (this->m_num_blocks != 0) {
        uVar23 = (this->m_params).m_alpha_component_indices[local_178];
        uVar32 = 0;
        do {
          ptVar8 = (this->m_tiles).m_p;
          if ((ptVar8[uVar32].pixels.m_size != 0) &&
             (ptVar8 = ptVar8 + uVar32, (ptVar8->pixels).m_size != 0)) {
            uVar5 = ptVar8->cluster_indices[local_178 + 1];
            paVar12 = this_00->m_p;
            peVar28 = (elemental_vector *)
                      ((long)paVar12->alpha_values + ((ulong)((uint)uVar5 * 0x90) - 0x18));
            uVar31 = 0;
            do {
              bVar4 = (ptVar8->pixels).m_p[uVar31].field_0.c[uVar23];
              uVar7 = *(uint *)((long)paVar12->alpha_values + ((ulong)((uint)uVar5 * 0x90) - 0x10));
              if (*(uint *)((long)paVar12->alpha_values + ((ulong)((uint)uVar5 * 0x90) - 0xc)) <=
                  uVar7) {
                elemental_vector::increase_capacity
                          (peVar28,uVar7 + 1,true,4,(object_mover)0x0,false);
              }
              *(uint *)((long)peVar28->m_p +
                       (ulong)*(uint *)((long)paVar12->alpha_values +
                                       ((ulong)((uint)uVar5 * 0x90) - 0x10)) * 4) =
                   (uint)bVar4 * 0x10101 | 0xff000000;
              piVar2 = (int *)((long)paVar12->alpha_values + ((ulong)((uint)uVar5 * 0x90) - 0x10));
              *piVar2 = *piVar2 + 1;
              uVar31 = uVar31 + 1;
            } while (uVar31 < (ptVar8->pixels).m_size);
          }
          uVar32 = uVar32 + 1;
          this = local_118;
        } while (uVar32 < local_118->m_num_blocks);
      }
      local_178 = local_178 + 1;
    } while (local_178 < this->m_num_alpha_blocks);
  }
  if (this->m_num_blocks != 0) {
    lVar29 = 2;
    uVar32 = 0;
    do {
      if (this->m_num_alpha_blocks != 0) {
        lVar25 = 0x10;
        uVar31 = 0;
        do {
          uVar5 = (this->m_tiles).m_p[(this->m_tile_indices).m_p[uVar32]].cluster_indices
                  [uVar31 + 1];
          *(ushort *)((long)&((this->m_endpoint_indices).m_p)->field_0 + uVar31 * 2 + lVar29) =
               uVar5;
          if (((uVar32 & 1) == 0) || (this->m_has_subblocks == false)) {
            paVar12 = this_00->m_p;
            peVar28 = (elemental_vector *)
                      ((long)&paVar12->blocks[0].m_p + lVar25 + (ulong)((uint)uVar5 * 0x90));
            uVar23 = *(uint *)((long)&paVar12->blocks[0].m_size +
                              lVar25 + (ulong)((uint)uVar5 * 0x90));
            if (*(uint *)((long)&paVar12->blocks[0].m_capacity +
                         lVar25 + (ulong)((uint)uVar5 * 0x90)) <= uVar23) {
              elemental_vector::increase_capacity(peVar28,uVar23 + 1,true,4,(object_mover)0x0,false)
              ;
            }
            *(int *)((long)peVar28->m_p + (ulong)peVar28->m_size * 4) = (int)uVar32;
            peVar28->m_size = peVar28->m_size + 1;
          }
          uVar31 = uVar31 + 1;
          lVar25 = lVar25 + 0x10;
        } while (uVar31 < this->m_num_alpha_blocks);
      }
      uVar32 = uVar32 + 1;
      lVar29 = lVar29 + 8;
    } while (uVar32 < this->m_num_blocks);
  }
  if (uVar19 != 0) {
    uVar33 = 0;
    do {
      ptVar11 = this->m_pTask_pool;
      peVar21 = (executable_task *)crnlib_malloc(0x28);
      peVar21->_vptr_executable_task = (_func_int **)&PTR_execute_task_001de950;
      peVar21[1]._vptr_executable_task = (_func_int **)this;
      peVar21[2]._vptr_executable_task = (_func_int **)determine_alpha_endpoint_codebook_task;
      peVar21[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&peVar21[4]._vptr_executable_task = 1;
      task_pool::queue_task(ptVar11,peVar21,uVar33,(void *)0x0);
      uVar33 = uVar33 + 1;
    } while (local_120 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)uVar33);
  }
  task_pool::join(this->m_pTask_pool);
  tree_clusterizer<crnlib::vec<2U,_float>_>::~tree_clusterizer(&local_d8);
  ppVar10 = local_110;
  if (local_148.m_p != (uint *)0x0) {
    crnlib_free(local_148.m_p);
  }
  if (local_138.m_p != (vec<2U,_float> *)0x0) {
    crnlib_free(local_138.m_p);
  }
  if (ppVar10 != (pair<crnlib::vec<6U,_float>,_unsigned_int> *)0x0) {
    operator_delete(ppVar10);
  }
  if (local_168.m_p != (void *)0x0) {
    crnlib_free(local_168.m_p);
  }
  if (local_158.m_p != (void *)0x0) {
    crnlib_free(local_158.m_p);
  }
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoints() {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  crnlib::vector<std::pair<vec2F, uint> > endpoints;
  for (uint a = 0; a < m_num_alpha_blocks; a++) {
    for (uint t = 0; t < m_tiles.size(); t++) {
      if (m_tiles[t].pixels.size())
        endpoints.push_back(std::make_pair(m_tiles[t].alpha_endpoints[a], m_tiles[t].pixels.size()));
    }
  }

  struct Node {
    std::pair<vec2F, uint> *p, *pEnd;
    Node (std::pair<vec2F, uint>* begin, std::pair<vec2F, uint>* end) : p(begin), pEnd(end) {}
    bool operator<(const Node& other) const { return *p > *other.p; }
    static void sort_task(uint64 data, void* ptr) { std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd); }
  };

  crnlib::vector<Node> nodes;
  Node node(0, endpoints.get_ptr());
  for (uint i = 0; i < num_tasks; i++) {
    node.p = node.pEnd;
    node.pEnd = endpoints.get_ptr() + endpoints.size() * (i + 1) / num_tasks;
    if (node.p != node.pEnd)
      nodes.push_back(node);
  }

  for (uint i = 0; i < nodes.size(); i++)
    m_pTask_pool->queue_task(&Node::sort_task, i, &nodes[i]);
  m_pTask_pool->join();

  std::priority_queue<Node> queue;
  for (uint i = 0; i < nodes.size(); i++)
    queue.push(nodes[i]);

  crnlib::vector<vec2F> vectors;
  crnlib::vector<uint> weights;
  vectors.reserve(endpoints.size());
  weights.reserve(endpoints.size());
  while (queue.size()) {
    Node node = queue.top();
    std::pair<vec2F, uint>* endpoint = node.p++;
    queue.pop();
    if (node.p != node.pEnd)
      queue.push(node);
    if (!vectors.size() || endpoint->first != vectors.back()) {
      vectors.push_back(endpoint->first);
      weights.push_back(endpoint->second);
    } else if (weights.back() > UINT_MAX - endpoint->second) {
      weights.back() = UINT_MAX;
    } else {
      weights.back() += endpoint->second;
    }
  }

  tree_clusterizer<vec2F> vq;
  vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), math::minimum<uint>(m_num_tiles, m_params.m_alpha_endpoint_codebook_size), false, m_pTask_pool);
  m_alpha_clusters.resize(vq.get_codebook_size());

  for (uint i = 0; i < num_tasks; i++)
    m_pTask_pool->queue_object_task(this, &dxt_hc::determine_alpha_endpoint_clusters_task, i, &vq);
  m_pTask_pool->join();

  for (uint a = 0; a < m_num_alpha_blocks; a++) {
    uint component_index = m_params.m_alpha_component_indices[a];
    for (uint t = 0; t < m_num_blocks; t++) {
      crnlib::vector<color_quad_u8>& source = m_tiles[t].pixels;
      if (source.size()) {
        crnlib::vector<color_quad_u8>& destination = m_alpha_clusters[m_tiles[t].cluster_indices[cAlpha0 + a]].pixels;
        for (uint p = 0; p < source.size(); p++)
          destination.push_back(color_quad_u8(source[p][component_index]));
      }
    }
  }

  for (uint b = 0; b < m_num_blocks; b++) {
    for (uint a = 0; a < m_num_alpha_blocks; a++) {
      uint cluster_index = m_tiles[m_tile_indices[b]].cluster_indices[cAlpha0 + a];
      m_endpoint_indices[b].component[cAlpha0 + a] = cluster_index;
      if (!(m_has_subblocks && b & 1))
        m_alpha_clusters[cluster_index].blocks[cAlpha0 + a].push_back(b);
    }
  }

  for (uint i = 0; i < num_tasks; i++)
    m_pTask_pool->queue_object_task(this, &dxt_hc::determine_alpha_endpoint_codebook_task, i, NULL);
  m_pTask_pool->join();
}